

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.cpp
# Opt level: O2

void __thiscall embree::LineSegments::setNumTimeSteps(LineSegments *this,uint numTimeSteps)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  Device *pDVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  ulong uVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  size_t i;
  ulong uVar18;
  
  uVar17 = (ulong)numTimeSteps;
  uVar18 = (this->vertices).size_alloced;
  uVar16 = uVar18;
  if ((uVar18 < uVar17) && (uVar14 = uVar18, uVar16 = uVar17, uVar18 != 0)) {
    for (; uVar16 = uVar14, uVar14 < uVar17; uVar14 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0)) {
    }
  }
  uVar14 = (this->vertices).size_active;
  if (uVar17 < uVar14) {
    lVar15 = uVar17 * 0x38;
    for (uVar18 = uVar17; uVar18 < uVar14; uVar18 = uVar18 + 1) {
      RawBufferView::~RawBufferView
                ((RawBufferView *)
                 ((long)&(((this->vertices).items)->super_RawBufferView).ptr_ofs + lVar15));
      uVar14 = (this->vertices).size_active;
      lVar15 = lVar15 + 0x38;
    }
    (this->vertices).size_active = uVar17;
    uVar18 = (this->vertices).size_alloced;
    uVar14 = uVar17;
  }
  if (uVar18 == uVar16) {
    lVar15 = uVar14 * 0x38 + 0x30;
    for (; uVar14 < uVar17; uVar14 = uVar14 + 1) {
      pBVar3 = (this->vertices).items;
      puVar1 = (undefined8 *)((long)pBVar3 + lVar15 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pBVar3 + lVar15 + -0x30);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pBVar3 + lVar15 + -0x10) = 0x100000000;
      *(undefined1 *)((long)pBVar3 + lVar15 + -8) = 1;
      *(undefined4 *)((long)pBVar3 + lVar15 + -4) = 0;
      *(undefined8 *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar15) = 0;
      lVar15 = lVar15 + 0x38;
    }
    (this->vertices).size_active = uVar17;
  }
  else {
    pDVar6 = (this->vertices).alloc.device;
    pBVar3 = (this->vertices).items;
    iVar13 = (*(pDVar6->super_State).super_RefCount._vptr_RefCount[8])(pDVar6,uVar16 * 0x38,8,3);
    (this->vertices).items = (BufferView<embree::Vec3fx> *)CONCAT44(extraout_var,iVar13);
    lVar15 = 0;
    for (uVar18 = 0; uVar14 = (this->vertices).size_active, uVar18 < uVar14; uVar18 = uVar18 + 1) {
      pBVar4 = (this->vertices).items;
      puVar1 = (undefined8 *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar15);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pBVar3->super_RawBufferView).stride + lVar15);
      uVar10 = *puVar1;
      uVar11 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pBVar3->super_RawBufferView).format + lVar15);
      uVar12 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pBVar4->super_RawBufferView).format + lVar15);
      *puVar2 = *puVar1;
      puVar2[1] = uVar12;
      puVar1 = (undefined8 *)((long)&(pBVar4->super_RawBufferView).stride + lVar15);
      *puVar1 = uVar10;
      puVar1[1] = uVar11;
      puVar1 = (undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar15);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      *(undefined8 *)((long)&(pBVar4->super_RawBufferView).buffer.ptr + lVar15) =
           *(undefined8 *)((long)&(pBVar3->super_RawBufferView).buffer.ptr + lVar15);
      *(undefined8 *)((long)&(pBVar3->super_RawBufferView).buffer.ptr + lVar15) = 0;
      RawBufferView::~RawBufferView
                ((RawBufferView *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar15));
      lVar15 = lVar15 + 0x38;
    }
    lVar15 = uVar14 * 0x38 + 0x30;
    for (; uVar14 < uVar17; uVar14 = uVar14 + 1) {
      pBVar4 = (this->vertices).items;
      puVar1 = (undefined8 *)((long)pBVar4 + lVar15 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)pBVar4 + lVar15 + -0x30);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pBVar4 + lVar15 + -0x10) = 0x100000000;
      *(undefined1 *)((long)pBVar4 + lVar15 + -8) = 1;
      *(undefined4 *)((long)pBVar4 + lVar15 + -4) = 0;
      *(undefined8 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar15) = 0;
      lVar15 = lVar15 + 0x38;
    }
    pDVar6 = (this->vertices).alloc.device;
    if (pDVar6 != (Device *)0x0) {
      (*(pDVar6->super_State).super_RefCount._vptr_RefCount[9])(pDVar6,pBVar3);
    }
    (this->vertices).size_active = uVar17;
    (this->vertices).size_alloced = uVar16;
  }
  if (((uint)(this->super_Geometry).field_8 & 3) == 2) {
    uVar18 = (this->normals).size_alloced;
    uVar16 = uVar18;
    if ((uVar18 < uVar17) && (uVar14 = uVar18, uVar16 = uVar17, uVar18 != 0)) {
      for (; uVar16 = uVar14, uVar14 < uVar17; uVar14 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0)) {
      }
    }
    uVar14 = (this->normals).size_active;
    if (uVar17 < uVar14) {
      lVar15 = uVar17 * 0x38;
      for (uVar18 = uVar17; uVar18 < uVar14; uVar18 = uVar18 + 1) {
        RawBufferView::~RawBufferView
                  ((RawBufferView *)
                   ((long)&(((this->normals).items)->super_RawBufferView).ptr_ofs + lVar15));
        uVar14 = (this->normals).size_active;
        lVar15 = lVar15 + 0x38;
      }
      (this->normals).size_active = uVar17;
      uVar18 = (this->normals).size_alloced;
      uVar14 = uVar17;
    }
    if (uVar18 == uVar16) {
      lVar15 = uVar14 * 0x38 + 0x30;
      for (; uVar14 < uVar17; uVar14 = uVar14 + 1) {
        pBVar5 = (this->normals).items;
        puVar1 = (undefined8 *)((long)pBVar5 + lVar15 + -0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pBVar5 + lVar15 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pBVar5 + lVar15 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar5 + lVar15 + -8) = 1;
        *(undefined4 *)((long)pBVar5 + lVar15 + -4) = 0;
        *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar15) = 0;
        lVar15 = lVar15 + 0x38;
      }
      (this->normals).size_active = uVar17;
    }
    else {
      pDVar6 = (this->normals).alloc.device;
      pBVar5 = (this->normals).items;
      iVar13 = (*(pDVar6->super_State).super_RefCount._vptr_RefCount[8])(pDVar6,uVar16 * 0x38,8,3);
      (this->normals).items = (BufferView<embree::Vec3fa> *)CONCAT44(extraout_var_00,iVar13);
      lVar15 = 0;
      for (uVar18 = 0; uVar14 = (this->normals).size_active, uVar18 < uVar14; uVar18 = uVar18 + 1) {
        pBVar7 = (this->normals).items;
        puVar1 = (undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar15);
        uVar8 = *puVar1;
        uVar9 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pBVar5->super_RawBufferView).stride + lVar15);
        uVar10 = *puVar1;
        uVar11 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pBVar5->super_RawBufferView).format + lVar15);
        uVar12 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pBVar7->super_RawBufferView).format + lVar15);
        *puVar2 = *puVar1;
        puVar2[1] = uVar12;
        puVar1 = (undefined8 *)((long)&(pBVar7->super_RawBufferView).stride + lVar15);
        *puVar1 = uVar10;
        puVar1[1] = uVar11;
        puVar1 = (undefined8 *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar15);
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        *(undefined8 *)((long)&(pBVar7->super_RawBufferView).buffer.ptr + lVar15) =
             *(undefined8 *)((long)&(pBVar5->super_RawBufferView).buffer.ptr + lVar15);
        *(undefined8 *)((long)&(pBVar5->super_RawBufferView).buffer.ptr + lVar15) = 0;
        RawBufferView::~RawBufferView
                  ((RawBufferView *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar15));
        lVar15 = lVar15 + 0x38;
      }
      lVar15 = uVar14 * 0x38 + 0x30;
      for (; uVar14 < uVar17; uVar14 = uVar14 + 1) {
        pBVar7 = (this->normals).items;
        puVar1 = (undefined8 *)((long)pBVar7 + lVar15 + -0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pBVar7 + lVar15 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pBVar7 + lVar15 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar7 + lVar15 + -8) = 1;
        *(undefined4 *)((long)pBVar7 + lVar15 + -4) = 0;
        *(undefined8 *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar15) = 0;
        lVar15 = lVar15 + 0x38;
      }
      pDVar6 = (this->normals).alloc.device;
      if (pDVar6 != (Device *)0x0) {
        (*(pDVar6->super_State).super_RefCount._vptr_RefCount[9])(pDVar6,pBVar5);
      }
      (this->normals).size_active = uVar17;
      (this->normals).size_alloced = uVar16;
    }
  }
  Geometry::setNumTimeSteps(&this->super_Geometry,numTimeSteps);
  return;
}

Assistant:

void LineSegments::setNumTimeSteps (unsigned int numTimeSteps)
  {
    vertices.resize(numTimeSteps);
    if (getCurveType() == GTY_SUBTYPE_ORIENTED_CURVE)
      normals.resize(numTimeSteps);
    Geometry::setNumTimeSteps(numTimeSteps);
  }